

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamANCF_3333::Calc_Sxi_xi_compact
          (ChElementBeamANCF_3333 *this,VectorN *Sxi_xi_compact,double xi,double eta,double zeta)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar3 [64];
  
  auVar3._8_56_ = in_register_00001208;
  auVar3._0_8_ = xi;
  auVar2 = vfmadd231sd_fma(ZEXT816(0xbff0000000000000),auVar3._0_16_,ZEXT816(0x4000000000000000));
  auVar1 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar3._0_16_,ZEXT816(0x3ff0000000000000));
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.
  array[0] = xi + -0.5;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.
  array[1] = auVar2._0_8_ * this->m_thicknessY * 0.25 * eta;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.
  array[2] = auVar2._0_8_ * this->m_thicknessZ * 0.25 * zeta;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.
  array[3] = xi + 0.5;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.
  array[4] = auVar1._0_8_ * this->m_thicknessY * 0.25 * eta;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.
  array[5] = auVar1._0_8_ * this->m_thicknessZ * 0.25 * zeta;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.
  array[6] = xi * -2.0;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.
  array[7] = -this->m_thicknessY * eta * xi;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.
  array[8] = -this->m_thicknessZ * zeta * xi;
  return;
}

Assistant:

void ChElementBeamANCF_3333::Calc_Sxi_xi_compact(VectorN& Sxi_xi_compact, double xi, double eta, double zeta) {
    Sxi_xi_compact(0) = xi - 0.5;
    Sxi_xi_compact(1) = 0.25 * m_thicknessY * eta * (2.0 * xi - 1.0);
    Sxi_xi_compact(2) = 0.25 * m_thicknessZ * zeta * (2.0 * xi - 1.0);
    Sxi_xi_compact(3) = xi + 0.5;
    Sxi_xi_compact(4) = 0.25 * m_thicknessY * eta * (2.0 * xi + 1.0);
    Sxi_xi_compact(5) = 0.25 * m_thicknessZ * zeta * (2.0 * xi + 1.0);
    Sxi_xi_compact(6) = -2.0 * xi;
    Sxi_xi_compact(7) = -m_thicknessY * eta * xi;
    Sxi_xi_compact(8) = -m_thicknessZ * zeta * xi;
}